

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clEnqueueAcquireExternalMemObjectsKHR
                 (cl_command_queue command_queue,cl_uint num_mem_objects,cl_mem *mem_objects,
                 cl_uint num_events_in_wait_list,cl_event *event_wait_list,cl_event *event)

{
  time_point tickStart;
  time_point tickStart_00;
  time_point tickStart_01;
  bool bVar1;
  bool bVar2;
  SConfig *pSVar3;
  cl_icd_dispatch *pcVar4;
  cl_uint in_ECX;
  cl_mem *in_RDX;
  cl_uint in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  cl_event *in_R8;
  cl_event *in_R9;
  size_t *in_stack_00000088;
  cl_uint in_stack_00000094;
  cl_kernel in_stack_00000098;
  uint64_t in_stack_000000a0;
  char *in_stack_000000a8;
  CLIntercept *in_stack_000000b0;
  size_t *in_stack_000000c0;
  cl_command_queue in_stack_000000c8;
  time_point toolEnd_1;
  time_point toolStart_1;
  cl_int e;
  time_point toolEnd;
  time_point toolStart;
  CLIntercept *in_stack_00000228;
  time_point cpuEnd;
  time_point cpuStart;
  bool isLocalEvent;
  cl_event local_event;
  time_point queuedTime;
  uint64_t enqueueCounter;
  cl_int retVal;
  CLdispatchX *dispatchX;
  CLIntercept *pIntercept;
  char *in_stack_fffffffffffffc98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca0;
  cl_command_queue in_stack_fffffffffffffca8;
  CLIntercept *in_stack_fffffffffffffcb0;
  allocator *paVar5;
  CObjectTracker *in_stack_fffffffffffffcb8;
  uint64_t in_stack_fffffffffffffcc0;
  cl_event in_stack_fffffffffffffcc8;
  CLIntercept *in_stack_fffffffffffffcd0;
  cl_event in_stack_fffffffffffffcf8;
  CLIntercept *in_stack_fffffffffffffd00;
  CLIntercept *in_stack_fffffffffffffd08;
  cl_event in_stack_fffffffffffffd10;
  CObjectTracker *in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  CLIntercept *pCVar6;
  cl_uint numEvents;
  char *in_stack_fffffffffffffd28;
  CLIntercept *in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd3f;
  allocator *in_stack_fffffffffffffd40;
  undefined6 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4e;
  undefined1 in_stack_fffffffffffffd4f;
  bool bVar7;
  CLIntercept *in_stack_fffffffffffffd50;
  time_point in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd64;
  time_point in_stack_fffffffffffffd68;
  time_point in_stack_fffffffffffffd70;
  allocator local_281;
  string local_280 [32];
  char *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  CLIntercept *in_stack_fffffffffffffdb0;
  cl_command_queue in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdc0;
  uint64_t in_stack_fffffffffffffdc8;
  char *in_stack_fffffffffffffdd0;
  CLIntercept *in_stack_fffffffffffffdd8;
  time_point in_stack_fffffffffffffde0;
  cl_event in_stack_fffffffffffffdf0;
  allocator local_1f1;
  string local_1f0 [32];
  undefined8 local_1d0;
  undefined8 local_1c8;
  allocator local_1b9;
  string local_1b8 [32];
  undefined8 local_198;
  cl_int local_18c;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  allocator local_159;
  cl_kernel in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  cl_int in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  cl_int in_stack_fffffffffffffebc;
  CLIntercept *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  CLIntercept *in_stack_fffffffffffffed0;
  undefined8 local_e0;
  undefined8 local_d8;
  allocator local_b9;
  string local_b8 [79];
  byte local_69;
  cl_event local_68 [2];
  char *local_58;
  cl_int local_4c;
  CLdispatchX *local_48;
  CLIntercept *local_40;
  cl_event *local_38;
  cl_event *local_30;
  cl_uint local_24;
  cl_mem *local_20;
  cl_uint local_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  cl_int local_4;
  
  numEvents = (cl_uint)((ulong)in_stack_fffffffffffffd20 >> 0x20);
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_40 = GetIntercept();
  if ((local_40 == (CLIntercept *)0x0) ||
     (local_48 = CLIntercept::dispatchX(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8),
     local_48->clEnqueueAcquireExternalMemObjectsKHR ==
     (_func_cl_int_cl_command_queue_cl_uint_cl_mem_ptr_cl_uint_cl_event_ptr_cl_event_ptr *)0x0)) {
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,(int *)&stack0xfffffffffffffd64)
    ;
    local_4 = -0x24;
  }
  else {
    local_4c = 0;
    local_58 = (char *)CLIntercept::incrementEnqueueCounter(in_stack_fffffffffffffd08);
    pSVar3 = CLIntercept::config(local_40);
    if ((((pSVar3->AubCapture & 1U) != 0) &&
        (bVar1 = CLIntercept::checkAubCaptureEnqueueLimits(local_40,(uint64_t)local_58), bVar1)) &&
       (pSVar3 = CLIntercept::config(local_40), (pSVar3->AubCaptureIndividualEnqueues & 1U) == 0)) {
      in_stack_fffffffffffffc98 = (char *)0x0;
      in_stack_fffffffffffffca0 = local_10;
      CLIntercept::startAubCapture
                (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
                 in_stack_00000094,in_stack_00000088,in_stack_000000c0,in_stack_000000c8);
    }
    pSVar3 = CLIntercept::config(local_40);
    if ((pSVar3->NullEnqueue & 1U) == 0) {
      pSVar3 = CLIntercept::config(local_40);
      if ((pSVar3->CallLogging & 1U) != 0) {
        CLIntercept::callLoggingEnter
                  (in_stack_fffffffffffffec0,
                   (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   in_stack_fffffffffffffea8);
      }
      pSVar3 = CLIntercept::config(local_40);
      if ((pSVar3->EventChecking & 1U) != 0) {
        CLIntercept::checkEventList
                  (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,numEvents,
                   (cl_event *)in_stack_fffffffffffffd18,(cl_event *)in_stack_fffffffffffffd10);
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffca0);
      local_68[0] = (cl_event)0x0;
      local_69 = 0;
      pSVar3 = CLIntercept::config(local_40);
      if (((((pSVar3->DevicePerformanceTiming & 1U) != 0) ||
           (pSVar3 = CLIntercept::config(local_40), (pSVar3->ITTPerformanceTiming & 1U) != 0)) ||
          ((pSVar3 = CLIntercept::config(local_40), (pSVar3->ChromePerformanceTiming & 1U) != 0 ||
           (pSVar3 = CLIntercept::config(local_40),
           (pSVar3->DevicePerfCounterEventBasedSampling & 1U) != 0)))) &&
         (local_b8._64_8_ = std::chrono::_V2::steady_clock::now(),
         local_68[1] = (cl_event)local_b8._64_8_, local_38 == (cl_event *)0x0)) {
        local_38 = local_68;
        local_69 = 1;
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffca0);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffca0);
      pSVar3 = CLIntercept::config(local_40);
      if (((pSVar3->HostPerformanceTiming & 1U) != 0) ||
         (pSVar3 = CLIntercept::config(local_40), (pSVar3->ChromeCallLogging & 1U) != 0)) {
        local_b8._40_8_ = std::chrono::_V2::steady_clock::now();
        local_b8._56_8_ = local_b8._40_8_;
      }
      local_4c = (*local_48->clEnqueueAcquireExternalMemObjectsKHR)
                           ((cl_command_queue)local_10,local_14,local_20,local_24,local_30,local_38)
      ;
      pSVar3 = CLIntercept::config(local_40);
      if (((pSVar3->HostPerformanceTiming & 1U) != 0) ||
         (pSVar3 = CLIntercept::config(local_40), (pSVar3->ChromeCallLogging & 1U) != 0)) {
        local_b8._32_8_ = std::chrono::_V2::steady_clock::now();
        local_b8._48_8_ = local_b8._32_8_;
        pSVar3 = CLIntercept::config(local_40);
        if (((pSVar3->HostPerformanceTiming & 1U) != 0) &&
           (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                              (local_40,(uint64_t)local_58), bVar1)) {
          in_stack_fffffffffffffd58.__d.__r = (duration)&local_b9;
          in_stack_fffffffffffffd50 = local_40;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_b8,"",(allocator *)in_stack_fffffffffffffd58.__d.__r);
          local_d8 = local_b8._56_8_;
          local_e0 = local_b8._48_8_;
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     (char *)in_stack_fffffffffffffd58.__d.__r,(string *)in_stack_fffffffffffffd50,
                     in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
          std::__cxx11::string::~string(local_b8);
          std::allocator<char>::~allocator((allocator<char> *)&local_b9);
        }
      }
      pSVar3 = CLIntercept::config(local_40);
      if ((((((pSVar3->DevicePerformanceTiming & 1U) != 0) ||
            (pSVar3 = CLIntercept::config(local_40), (pSVar3->ITTPerformanceTiming & 1U) != 0)) ||
           (pSVar3 = CLIntercept::config(local_40), (pSVar3->ChromePerformanceTiming & 1U) != 0)) ||
          (pSVar3 = CLIntercept::config(local_40),
          (pSVar3->DevicePerfCounterEventBasedSampling & 1U) != 0)) && (local_38 != (cl_event *)0x0)
         ) {
        bVar2 = CLIntercept::checkDevicePerformanceTimingEnqueueLimits(local_40,(uint64_t)local_58);
        bVar1 = false;
        bVar7 = false;
        if (bVar2) {
          pSVar3 = CLIntercept::config(local_40);
          bVar1 = (pSVar3->DevicePerformanceTimingSkipUnmap & 1U) != 0;
          in_stack_fffffffffffffd4e = true;
          bVar7 = true;
          if (bVar1) {
            in_stack_fffffffffffffd40 = (allocator *)&stack0xfffffffffffffeff;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&stack0xffffffffffffff00,"clEnqueueAcquireExternalMemObjectsKHR",
                       in_stack_fffffffffffffd40);
            in_stack_fffffffffffffd3f =
                 std::operator!=(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
            in_stack_fffffffffffffd4e = in_stack_fffffffffffffd3f;
            bVar7 = (bool)in_stack_fffffffffffffd3f;
          }
        }
        in_stack_fffffffffffffd4f = bVar7;
        if (bVar1) {
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeff);
        }
        if (bVar7 != false) {
          in_stack_fffffffffffffd30 = (CLIntercept *)&stack0xfffffffffffffecf;
          pCVar6 = local_40;
          in_stack_fffffffffffffd28 = local_58;
          std::allocator<char>::allocator();
          numEvents = (cl_uint)((ulong)pCVar6 >> 0x20);
          std::__cxx11::string::string
                    ((string *)&stack0xfffffffffffffed0,"",(allocator *)in_stack_fffffffffffffd30);
          CLIntercept::addTimingEvent
                    (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                     in_stack_fffffffffffffde0,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                     in_stack_fffffffffffffdf0);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffecf);
        }
        if ((local_69 & 1) != 0) {
          pcVar4 = CLIntercept::dispatch(local_40);
          (*pcVar4->clReleaseEvent)(*local_38);
          local_38 = (cl_event *)0x0;
        }
      }
      pSVar3 = CLIntercept::config(local_40);
      if (((((pSVar3->ErrorLogging & 1U) != 0) ||
           (pSVar3 = CLIntercept::config(local_40), (pSVar3->ErrorAssert & 1U) != 0)) ||
          (pSVar3 = CLIntercept::config(local_40), (pSVar3->NoErrors & 1U) != 0)) && (local_4c != 0)
         ) {
        pSVar3 = CLIntercept::config(local_40);
        if ((pSVar3->ErrorLogging & 1U) != 0) {
          CLIntercept::logError
                    (in_stack_fffffffffffffec0,
                     (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     in_stack_fffffffffffffeb4);
        }
        pSVar3 = CLIntercept::config(local_40);
        if ((pSVar3->ErrorAssert & 1U) != 0) {
          raise(5);
        }
        pSVar3 = CLIntercept::config(local_40);
        if ((pSVar3->NoErrors & 1U) != 0) {
          local_4c = 0;
        }
      }
      pSVar3 = CLIntercept::config(local_40);
      if ((pSVar3->LeakChecking & 1U) != 0) {
        in_stack_fffffffffffffd18 = CLIntercept::objectTracker(local_40);
        if (local_38 == (cl_event *)0x0) {
          in_stack_fffffffffffffd10 = (cl_event)0x0;
        }
        else {
          in_stack_fffffffffffffd10 = *local_38;
        }
        CObjectTracker::AddAllocation<_cl_event*>
                  (in_stack_fffffffffffffcb8,(_cl_event *)in_stack_fffffffffffffcb0);
      }
      pSVar3 = CLIntercept::config(local_40);
      if ((pSVar3->CallLogging & 1U) != 0) {
        CLIntercept::callLoggingExit
                  (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,numEvents,
                   (cl_event *)in_stack_fffffffffffffd18,
                   (cl_sync_point_khr *)in_stack_fffffffffffffd10);
      }
      pSVar3 = CLIntercept::config(local_40);
      if ((pSVar3->ChromeCallLogging & 1U) != 0) {
        paVar5 = &local_159;
        in_stack_fffffffffffffd00 = local_40;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&stack0xfffffffffffffea8,"",paVar5);
        local_168 = local_b8._56_8_;
        local_170 = local_b8._48_8_;
        tickStart.__d.__r._4_4_ = in_stack_fffffffffffffd64;
        tickStart.__d.__r._0_4_ = in_stack_fffffffffffffd60;
        CLIntercept::chromeCallLoggingExit
                  (in_stack_fffffffffffffd50,
                   (char *)CONCAT17(in_stack_fffffffffffffd4f,
                                    CONCAT16(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd48)),
                   (string *)in_stack_fffffffffffffd40,(bool)in_stack_fffffffffffffd3f,
                   (uint64_t)in_stack_fffffffffffffd30,tickStart,in_stack_fffffffffffffd58);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
        std::allocator<char>::~allocator((allocator<char> *)&local_159);
      }
      if (local_38 == (cl_event *)0x0) {
        in_stack_fffffffffffffcf8 = (cl_event)0x0;
      }
      else {
        in_stack_fffffffffffffcf8 = *local_38;
      }
      if ((in_stack_fffffffffffffcf8 != (cl_event)0x0) &&
         ((pSVar3 = CLIntercept::config(local_40), (pSVar3->ChromeCallLogging & 1U) != 0 ||
          (pSVar3 = CLIntercept::config(local_40), (pSVar3->ChromePerformanceTiming & 1U) != 0)))) {
        CLIntercept::addEvent
                  (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
      }
    }
    pSVar3 = CLIntercept::config(local_40);
    if ((pSVar3->FinishAfterEnqueue & 1U) == 0) {
      pSVar3 = CLIntercept::config(local_40);
      if ((pSVar3->FlushAfterEnqueue & 1U) != 0) {
        pcVar4 = CLIntercept::dispatch(local_40);
        (*pcVar4->clFlush)((cl_command_queue)local_10);
      }
    }
    else {
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffca0);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffca0);
      pSVar3 = CLIntercept::config(local_40);
      if (((pSVar3->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar3 = CLIntercept::config(local_40), (pSVar3->HostPerformanceTiming & 1U) != 0 ||
          (pSVar3 = CLIntercept::config(local_40), (pSVar3->ChromeCallLogging & 1U) != 0)))) {
        local_188 = std::chrono::_V2::steady_clock::now();
        local_178 = local_188;
      }
      CLIntercept::logFlushOrFinishAfterEnqueueStart
                (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
      pcVar4 = CLIntercept::dispatch(local_40);
      local_18c = (*pcVar4->clFinish)((cl_command_queue)local_10);
      CLIntercept::logFlushOrFinishAfterEnqueueEnd
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
      pSVar3 = CLIntercept::config(local_40);
      if (((pSVar3->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar3 = CLIntercept::config(local_40), (pSVar3->HostPerformanceTiming & 1U) != 0 ||
          (pSVar3 = CLIntercept::config(local_40), (pSVar3->ChromeCallLogging & 1U) != 0)))) {
        local_198 = std::chrono::_V2::steady_clock::now();
        local_180 = local_198;
        pSVar3 = CLIntercept::config(local_40);
        if (((pSVar3->HostPerformanceTiming & 1U) != 0) &&
           (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                              (local_40,(uint64_t)local_58), bVar1)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1b8,"",&local_1b9);
          local_1c8 = local_178;
          local_1d0 = local_180;
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     (char *)in_stack_fffffffffffffd58.__d.__r,(string *)in_stack_fffffffffffffd50,
                     in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
          std::__cxx11::string::~string(local_1b8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
        }
        pSVar3 = CLIntercept::config(local_40);
        if ((pSVar3->ChromeCallLogging & 1U) != 0) {
          paVar5 = &local_1f1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1f0,"",paVar5);
          tickStart_00.__d.__r._4_4_ = in_stack_fffffffffffffd64;
          tickStart_00.__d.__r._0_4_ = in_stack_fffffffffffffd60;
          CLIntercept::chromeCallLoggingExit
                    (in_stack_fffffffffffffd50,
                     (char *)CONCAT17(in_stack_fffffffffffffd4f,
                                      CONCAT16(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd48))
                     ,(string *)in_stack_fffffffffffffd40,(bool)in_stack_fffffffffffffd3f,
                     (uint64_t)in_stack_fffffffffffffd30,tickStart_00,in_stack_fffffffffffffd58);
          std::__cxx11::string::~string(local_1f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
        }
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffca0);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffca0);
      pSVar3 = CLIntercept::config(local_40);
      if (((pSVar3->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar3 = CLIntercept::config(local_40), (pSVar3->HostPerformanceTiming & 1U) != 0 ||
          (pSVar3 = CLIntercept::config(local_40), (pSVar3->ChromeCallLogging & 1U) != 0)))) {
        std::chrono::_V2::steady_clock::now();
      }
      CLIntercept::checkTimingEvents(in_stack_00000228);
      pSVar3 = CLIntercept::config(local_40);
      if (((pSVar3->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar3 = CLIntercept::config(local_40), (pSVar3->HostPerformanceTiming & 1U) != 0 ||
          (pSVar3 = CLIntercept::config(local_40), (pSVar3->ChromeCallLogging & 1U) != 0)))) {
        std::chrono::_V2::steady_clock::now();
        pSVar3 = CLIntercept::config(local_40);
        if (((pSVar3->HostPerformanceTiming & 1U) != 0) &&
           (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                              (local_40,(uint64_t)local_58), bVar1)) {
          paVar5 = (allocator *)&stack0xfffffffffffffdb7;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&stack0xfffffffffffffdb8,"",paVar5);
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     (char *)in_stack_fffffffffffffd58.__d.__r,(string *)in_stack_fffffffffffffd50,
                     in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb8);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdb7);
        }
        pSVar3 = CLIntercept::config(local_40);
        if ((pSVar3->ChromeCallLogging & 1U) != 0) {
          paVar5 = &local_281;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_280,"",paVar5);
          tickStart_01.__d.__r._4_4_ = in_stack_fffffffffffffd64;
          tickStart_01.__d.__r._0_4_ = in_stack_fffffffffffffd60;
          CLIntercept::chromeCallLoggingExit
                    (in_stack_fffffffffffffd50,
                     (char *)CONCAT17(in_stack_fffffffffffffd4f,
                                      CONCAT16(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd48))
                     ,(string *)in_stack_fffffffffffffd40,(bool)in_stack_fffffffffffffd3f,
                     (uint64_t)in_stack_fffffffffffffd30,tickStart_01,in_stack_fffffffffffffd58);
          std::__cxx11::string::~string(local_280);
          std::allocator<char>::~allocator((allocator<char> *)&local_281);
        }
      }
    }
    pSVar3 = CLIntercept::config(local_40);
    if (((pSVar3->AubCapture & 1U) != 0) &&
       ((pSVar3 = CLIntercept::config(local_40), (pSVar3->AubCaptureIndividualEnqueues & 1U) != 0 ||
        (bVar1 = CLIntercept::checkAubCaptureEnqueueLimits(local_40,(uint64_t)local_58), !bVar1))))
    {
      CLIntercept::stopAubCapture
                (in_stack_fffffffffffffd00,(cl_command_queue)in_stack_fffffffffffffcf8);
    }
    local_4 = local_4c;
  }
  return local_4;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clEnqueueAcquireExternalMemObjectsKHR(
    cl_command_queue command_queue,
    cl_uint num_mem_objects,
    const cl_mem *mem_objects,
    cl_uint num_events_in_wait_list,
    const cl_event *event_wait_list,
    cl_event *event)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(command_queue);
        if( dispatchX.clEnqueueAcquireExternalMemObjectsKHR )
        {
            cl_int  retVal = CL_SUCCESS;

            INCREMENT_ENQUEUE_COUNTER();
            CHECK_AUBCAPTURE_START( command_queue );

            if( pIntercept->config().NullEnqueue == false )
            {
                CALL_LOGGING_ENTER();
                CHECK_EVENT_LIST( num_events_in_wait_list, event_wait_list, event );
                DEVICE_PERFORMANCE_TIMING_START( event );
                HOST_PERFORMANCE_TIMING_START();

                retVal = dispatchX.clEnqueueAcquireExternalMemObjectsKHR(
                    command_queue,
                    num_mem_objects,
                    mem_objects,
                    num_events_in_wait_list,
                    event_wait_list,
                    event);

                HOST_PERFORMANCE_TIMING_END();
                DEVICE_PERFORMANCE_TIMING_END( command_queue, event );
                CHECK_ERROR( retVal );
                ADD_OBJECT_ALLOCATION( event ? event[0] : NULL );
                CALL_LOGGING_EXIT_EVENT( retVal, event );
                ADD_EVENT( event ? event[0] : NULL );
            }

            FINISH_OR_FLUSH_AFTER_ENQUEUE( command_queue );
            CHECK_AUBCAPTURE_STOP( command_queue );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_QUEUE);
}